

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

bool_t rngTestFIPS2(octet *buf)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long in_RDI;
  size_t i;
  u32 s [16];
  octet in_stack_ffffffffffffffaf;
  long lVar4;
  ulong uVar5;
  int local_48 [16];
  long local_8;
  
  lVar4 = 0x9c4;
  local_8 = in_RDI;
  memSet((void *)0x9c4,in_stack_ffffffffffffffaf,0x128463);
  while (lVar3 = lVar4 + -1, lVar4 != 0) {
    uVar1 = *(byte *)(local_8 + lVar3) & 0xf;
    local_48[(int)uVar1] = local_48[(int)uVar1] + 1;
    iVar2 = (int)(uint)*(byte *)(local_8 + lVar3) >> 4;
    local_48[iVar2] = local_48[iVar2] + 1;
    lVar4 = lVar3;
  }
  local_48[0] = local_48[0] * local_48[0];
  for (uVar5 = 1; uVar5 < 0x10; uVar5 = uVar5 + 1) {
    local_48[0] = local_48[uVar5] * local_48[uVar5] + local_48[0];
  }
  uVar1 = local_48[0] * 0x10 + 0xfe8287c0;
  return (bool_t)(0x2a30 < uVar1 && uVar1 < 0x385c2);
}

Assistant:

bool_t rngTestFIPS2(const octet buf[2500])
{
	u32 s[16];
	size_t i = 2500;
	ASSERT(memIsValid(buf, 2500));
	memSetZero(s, sizeof(s));
	while (i--)
		++s[buf[i] & 15], ++s[buf[i] >> 4];
	s[0] *= s[0];
	for (i = 1; i < 16; ++i)
		s[0] += s[i] * s[i];
	s[0] = 16 * s[0] - 5000 * 5000;
	return 10800 < s[0] && s[0] < 230850;
}